

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O0

void __thiscall
ExternalSigner::ExternalSigner
          (ExternalSigner *this,string *command,string *chain,string *fingerprint,string *name)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_R8,in_stack_ffffffffffffffc8);
  std::__cxx11::string::string(in_R8,in_stack_ffffffffffffffc8);
  std::__cxx11::string::string(in_R8,in_stack_ffffffffffffffc8);
  std::__cxx11::string::string(in_R8,in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ExternalSigner::ExternalSigner(const std::string& command, const std::string chain, const std::string& fingerprint, const std::string name): m_command(command), m_chain(chain), m_fingerprint(fingerprint), m_name(name) {}